

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O2

oki_adpcm_state * oki_adpcm_create(INT8 *custom_index_shift,INT16 *custom_diff_lookup)

{
  oki_adpcm_state *adpcm;
  
  adpcm = (oki_adpcm_state *)calloc(1,0x18);
  if (adpcm != (oki_adpcm_state *)0x0) {
    oki_adpcm_init(adpcm,custom_index_shift,custom_diff_lookup);
  }
  return adpcm;
}

Assistant:

oki_adpcm_state* oki_adpcm_create(const INT8* custom_index_shift, const INT16* custom_diff_lookup)
{
	oki_adpcm_state* adpcm;
	
	adpcm = (oki_adpcm_state*)calloc(1, sizeof(oki_adpcm_state));
	if (adpcm == NULL)
		return NULL;
	
	oki_adpcm_init(adpcm, custom_index_shift, custom_diff_lookup);
	
	return adpcm;
}